

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O0

void __thiscall Image_PngRgbIO_Test::TestBody(Image_PngRgbIO_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  WrapMode2D wrapMode;
  WrapMode2D wrapMode_00;
  WrapMode2D wrapMode_01;
  WrapMode2D wrapMode_02;
  Point2i p;
  Point2i p_00;
  Point2i p_01;
  Point2i p_02;
  Point2i res_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  bool bVar1;
  undefined1 uVar2;
  int *piVar3;
  Message *pMVar4;
  char *pcVar5;
  Allocator in_RDI;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  int c;
  int x;
  int y;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ImageAndMetadata read;
  AssertionResult gtest_ar_;
  Image image;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgbPixels;
  Point2i res;
  int in_stack_fffffffffffff548;
  Float in_stack_fffffffffffff54c;
  Float in_stack_fffffffffffff550;
  undefined4 in_stack_fffffffffffff554;
  undefined4 in_stack_fffffffffffff558;
  WrapMode in_stack_fffffffffffff55c;
  polymorphic_allocator<float> *in_stack_fffffffffffff560;
  undefined4 in_stack_fffffffffffff568;
  int in_stack_fffffffffffff56c;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffff570;
  undefined8 in_stack_fffffffffffff578;
  undefined7 in_stack_fffffffffffff580;
  undefined1 in_stack_fffffffffffff587;
  char *in_stack_fffffffffffff588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff590;
  char *in_stack_fffffffffffff5b0;
  char *in_stack_fffffffffffff5b8;
  Message *in_stack_fffffffffffff5c0;
  Image *in_stack_fffffffffffff5c8;
  undefined4 in_stack_fffffffffffff5d0;
  WrapMode in_stack_fffffffffffff5d4;
  WrapMode in_stack_fffffffffffff5d8;
  int in_stack_fffffffffffff5dc;
  int in_stack_fffffffffffff5e0;
  int in_stack_fffffffffffff5e4;
  int in_stack_fffffffffffff5e8;
  int in_stack_fffffffffffff5ec;
  Image *in_stack_fffffffffffff600;
  float *in_stack_fffffffffffff608;
  Message *in_stack_fffffffffffff610;
  reference in_stack_fffffffffffff618;
  undefined4 in_stack_fffffffffffff620;
  undefined4 in_stack_fffffffffffff624;
  int iVar6;
  Image *in_stack_fffffffffffff628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff630;
  size_t in_stack_fffffffffffff638;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff640;
  string *local_838;
  AssertionResult local_7d8 [3];
  Float local_7a8;
  Float local_794;
  AssertionResult local_790 [3];
  Float local_760;
  Float local_74c;
  AssertionResult local_748;
  int local_734;
  int local_730;
  int local_72c;
  AssertionResult local_718;
  string local_708 [48];
  AssertionResult local_6d8;
  string local_6c8 [48];
  AssertionResult local_698;
  uint local_684;
  string local_680 [48];
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_650;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_648;
  AssertionResult local_640 [2];
  undefined4 local_620;
  PixelFormat local_61c;
  AssertionResult local_618 [2];
  Tuple2<pbrt::Point2,_int> local_5f8;
  Tuple2<pbrt::Point2,_int> local_5f0;
  AssertionResult local_5e8 [2];
  allocator<char> local_5c1;
  string local_5c0 [32];
  Image local_5a0;
  optional local_3c8 [64];
  string local_388 [48];
  optional<float> local_358;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_350;
  undefined4 local_310;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_30c;
  undefined4 local_2cc;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> local_2c8;
  undefined4 local_2b8;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_2b4;
  undefined4 local_2ac;
  optional<int> local_2a8;
  optional<float> local_2a0;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  allocator<char> local_251;
  ImageMetadata *in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdb8;
  Image *in_stack_fffffffffffffdc0;
  AssertionResult local_230;
  undefined1 local_21c;
  allocator<char> local_21b;
  allocator<char> local_21a;
  allocator<char> local_219;
  string *local_218;
  string local_210 [32];
  undefined1 local_1f0 [32];
  undefined1 local_1d0 [32];
  string *local_1b0;
  undefined8 local_1a8;
  Image local_150;
  ColorEncodingHandle *in_stack_ffffffffffffffe8;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffff0;
  
  pbrt::Point2<int>::Point2
            ((Point2<int> *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
             (int)in_stack_fffffffffffff54c,in_stack_fffffffffffff548);
  res_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff5ec;
  res_00.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff5e8;
  GetFloatPixels(res_00,in_stack_fffffffffffff5e4);
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
            ((polymorphic_allocator<float> *)
             CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (in_stack_fffffffffffff570,
             (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),in_stack_fffffffffffff560
            );
  local_21c = 1;
  local_218 = local_210;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff590,in_stack_fffffffffffff588,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580));
  local_218 = (string *)local_1f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff590,in_stack_fffffffffffff588,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580));
  local_218 = (string *)local_1d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff590,in_stack_fffffffffffff588,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580));
  local_21c = 0;
  local_1b0 = local_210;
  local_1a8 = 3;
  v._M_array._4_4_ = in_stack_fffffffffffff55c;
  v._M_array._0_4_ = in_stack_fffffffffffff558;
  v._M_len = (size_type)in_stack_fffffffffffff560;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),v);
  channels.n = in_stack_fffffffffffff638;
  channels.ptr = in_stack_fffffffffffff630;
  pbrt::Image::Image(in_stack_fffffffffffff628,
                     (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                     CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
                     (Point2i)in_stack_fffffffffffff640,channels);
  local_838 = (string *)&local_1b0;
  do {
    local_838 = local_838 + -0x20;
    std::__cxx11::string::~string(local_838);
  } while (local_838 != local_210);
  std::allocator<char>::~allocator(&local_21b);
  std::allocator<char>::~allocator(&local_21a);
  std::allocator<char>::~allocator(&local_219);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff590,in_stack_fffffffffffff588,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580));
  local_358.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_358.set = false;
  local_358._5_3_ = 0;
  pstd::optional<float>::optional(&local_358);
  local_350 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
              vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_310 = 0;
  pstd::optional<pbrt::SquareMatrix<4>_>::optional
            ((optional<pbrt::SquareMatrix<4>_> *)&local_350.__align);
  local_30c = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
              vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_2cc = 0;
  pstd::optional<pbrt::SquareMatrix<4>_>::optional
            ((optional<pbrt::SquareMatrix<4>_> *)&local_30c.__align);
  local_2c8 = (aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)>)0x0;
  local_2b8 = 0;
  pstd::optional<pbrt::Bounds2<int>_>::optional((optional<pbrt::Bounds2<int>_> *)&local_2c8.__align)
  ;
  local_2ac = 0;
  local_2b4 = (aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)>)0x0;
  pstd::optional<pbrt::Point2<int>_>::optional((optional<pbrt::Point2<int>_> *)&local_2b4.__align);
  local_2a8.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  local_2a8.set = false;
  local_2a8._5_3_ = 0;
  pstd::optional<int>::optional(&local_2a8);
  local_2a0.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_2a0.set = false;
  local_2a0._5_3_ = 0;
  pstd::optional<float>::optional(&local_2a0);
  local_298 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
               )0x0;
  uStack_290 = 0;
  pstd::optional<const_pbrt::RGBColorSpace_*>::optional
            ((optional<const_pbrt::RGBColorSpace_*> *)&local_298.__align);
  uStack_268 = 0;
  uStack_260 = 0;
  local_288 = 0;
  uStack_280 = 0;
  uStack_278 = 0;
  uStack_270 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)0x5c9f9a);
  pbrt::Image::Write(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
             SUB41((uint)in_stack_fffffffffffff54c >> 0x18,0));
  pbrt::ImageMetadata::~ImageMetadata
            ((ImageMetadata *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb0);
  std::allocator<char>::~allocator(&local_251);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_230);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,
               in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580),
               (Type)((ulong)in_stack_fffffffffffff578 >> 0x20),(char *)in_stack_fffffffffffff570,
               in_stack_fffffffffffff56c,(char *)in_stack_fffffffffffff560);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
               (Message *)in_stack_fffffffffffff5c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
    std::__cxx11::string::~string(local_388);
    testing::Message::~Message((Message *)0x5ca2a9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ca324);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff590,in_stack_fffffffffffff588,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580));
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
  pbrt::ColorEncodingHandle::TaggedPointer
            ((ColorEncodingHandle *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
             (nullptr_t)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
  pbrt::Image::Read((string *)in_stack_fffffffffffffff0,in_RDI,in_stack_ffffffffffffffe8);
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator(&local_5c1);
  local_5f0 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(&local_150);
  local_5f8 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(&local_5a0);
  testing::internal::EqHelper<false>::Compare<pbrt::Point2<int>,pbrt::Point2<int>>
            ((char *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
             (char *)in_stack_fffffffffffff560,
             (Point2<int> *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),
             (Point2<int> *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5e8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580));
    testing::AssertionResult::failure_message((AssertionResult *)0x5ca507);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580),
               (Type)((ulong)in_stack_fffffffffffff578 >> 0x20),(char *)in_stack_fffffffffffff570,
               in_stack_fffffffffffff56c,(char *)in_stack_fffffffffffff560);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
               (Message *)in_stack_fffffffffffff5c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
    testing::Message::~Message((Message *)0x5ca56a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ca5c2);
  local_61c = pbrt::Image::Format(&local_5a0);
  local_620 = 0;
  testing::internal::EqHelper<false>::Compare<pbrt::PixelFormat,pbrt::PixelFormat>
            ((char *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
             (char *)in_stack_fffffffffffff560,
             (PixelFormat *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),
             (PixelFormat *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_618);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580));
    testing::AssertionResult::failure_message((AssertionResult *)0x5ca68d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580),
               (Type)((ulong)in_stack_fffffffffffff578 >> 0x20),(char *)in_stack_fffffffffffff570,
               in_stack_fffffffffffff56c,(char *)in_stack_fffffffffffff560);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
               (Message *)in_stack_fffffffffffff5c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
    testing::Message::~Message((Message *)0x5ca6f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ca748);
  pbrt::Image::Encoding((Image *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
  pbrt::TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  ::TaggedPointer(&local_650,(nullptr_t)0x0);
  pbrt::TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  ::operator!=(&local_648,&local_650);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
             SUB41((uint)in_stack_fffffffffffff54c >> 0x18,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_640);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,
               in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580),
               (Type)((ulong)in_stack_fffffffffffff578 >> 0x20),(char *)in_stack_fffffffffffff570,
               in_stack_fffffffffffff56c,(char *)in_stack_fffffffffffff560);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
               (Message *)in_stack_fffffffffffff5c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
    std::__cxx11::string::~string(local_680);
    testing::Message::~Message((Message *)0x5ca8a8);
  }
  local_684 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ca939);
  if (local_684 == 0) {
    pstd::optional::operator_cast_to_bool(local_3c8);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
               SUB41((uint)in_stack_fffffffffffff54c >> 0x18,0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_698);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,
                 in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580),
                 (Type)((ulong)in_stack_fffffffffffff578 >> 0x20),(char *)in_stack_fffffffffffff570,
                 in_stack_fffffffffffff56c,(char *)in_stack_fffffffffffff560);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                 (Message *)in_stack_fffffffffffff5c8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
      std::__cxx11::string::~string(local_6c8);
      testing::Message::~Message((Message *)0x5caa78);
    }
    local_684 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5cab09);
    if (local_684 == 0) {
      pstd::optional<const_pbrt::RGBColorSpace_*>::operator*
                ((optional<const_pbrt::RGBColorSpace_*> *)0x5cab27);
      testing::AssertionResult::AssertionResult
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                 SUB41((uint)in_stack_fffffffffffff54c >> 0x18,0));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6d8);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580));
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,
                   in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580),
                   (Type)((ulong)in_stack_fffffffffffff578 >> 0x20),
                   (char *)in_stack_fffffffffffff570,in_stack_fffffffffffff56c,
                   (char *)in_stack_fffffffffffff560);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                   (Message *)in_stack_fffffffffffff5c8);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
        std::__cxx11::string::~string(local_708);
        testing::Message::~Message((Message *)0x5cac50);
      }
      local_684 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x5cace1);
      if (local_684 == 0) {
        pbrt::ImageMetadata::GetColorSpace
                  ((ImageMetadata *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
        testing::internal::EqHelper<false>::Compare<pbrt::RGBColorSpace,pbrt::RGBColorSpace>
                  ((char *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                   (char *)in_stack_fffffffffffff560,
                   (RGBColorSpace *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),
                   (RGBColorSpace *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_718);
        if (!bVar1) {
          testing::Message::Message
                    ((Message *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580));
          testing::AssertionResult::failure_message((AssertionResult *)0x5cadb7);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580),
                     (Type)((ulong)in_stack_fffffffffffff578 >> 0x20),
                     (char *)in_stack_fffffffffffff570,in_stack_fffffffffffff56c,
                     (char *)in_stack_fffffffffffff560);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                     (Message *)in_stack_fffffffffffff5c8);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
          testing::Message::~Message((Message *)0x5cae1a);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5cae72);
        for (local_72c = 0; iVar6 = local_72c,
            piVar3 = pbrt::Tuple2<pbrt::Point2,_int>::operator[]
                               ((Tuple2<pbrt::Point2,_int> *)&stack0xfffffffffffffff0,1),
            iVar6 < *piVar3; local_72c = local_72c + 1) {
          for (local_730 = 0; iVar6 = local_730,
              piVar3 = pbrt::Tuple2<pbrt::Point2,_int>::operator[]
                                 ((Tuple2<pbrt::Point2,_int> *)&stack0xfffffffffffffff0,0),
              iVar6 < *piVar3; local_730 = local_730 + 1) {
            for (local_734 = 0; local_734 < 3; local_734 = local_734 + 1) {
              pbrt::Point2<int>::Point2
                        ((Point2<int> *)
                         CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                         (int)in_stack_fffffffffffff54c,in_stack_fffffffffffff548);
              pbrt::WrapMode2D::WrapMode2D
                        ((WrapMode2D *)in_stack_fffffffffffff560,in_stack_fffffffffffff55c);
              p.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff5e0;
              p.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff5dc;
              wrapMode.wrap.values[1] = in_stack_fffffffffffff5d8;
              wrapMode.wrap.values[0] = in_stack_fffffffffffff5d4;
              pbrt::Image::GetChannel
                        (in_stack_fffffffffffff5c8,p,(int)((ulong)in_stack_fffffffffffff5c0 >> 0x20)
                         ,wrapMode);
              local_74c = sRGBRoundTrip(in_stack_fffffffffffff550,in_stack_fffffffffffff54c);
              pbrt::Point2<int>::Point2
                        ((Point2<int> *)
                         CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                         (int)in_stack_fffffffffffff54c,in_stack_fffffffffffff548);
              pbrt::WrapMode2D::WrapMode2D
                        ((WrapMode2D *)in_stack_fffffffffffff560,in_stack_fffffffffffff55c);
              p_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff5e0;
              p_00.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff5dc;
              wrapMode_00.wrap.values[1] = in_stack_fffffffffffff5d8;
              wrapMode_00.wrap.values[0] = in_stack_fffffffffffff5d4;
              local_760 = pbrt::Image::GetChannel
                                    (in_stack_fffffffffffff5c8,p_00,
                                     (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20),wrapMode_00);
              testing::internal::CmpHelperLE<float,float>
                        ((char *)in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,
                         in_stack_fffffffffffff608,(float *)in_stack_fffffffffffff600);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_748);
              if (!bVar1) {
                testing::Message::Message
                          ((Message *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580))
                ;
                testing::Message::operator<<
                          ((Message *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                           (char (*) [4])
                           CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
                testing::Message::operator<<
                          ((Message *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                           (int *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
                testing::Message::operator<<
                          ((Message *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                           (char (*) [5])
                           CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
                testing::Message::operator<<
                          ((Message *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                           (int *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
                testing::Message::operator<<
                          ((Message *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                           (char (*) [5])
                           CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
                testing::Message::operator<<
                          ((Message *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                           (int *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
                testing::Message::operator<<
                          ((Message *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                           (char (*) [8])
                           CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
                iVar6 = local_72c * 3;
                piVar3 = pbrt::Tuple2<pbrt::Point2,_int>::operator[]
                                   ((Tuple2<pbrt::Point2,_int> *)&stack0xfffffffffffffff0,0);
                in_stack_fffffffffffff618 =
                     pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                               ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                &stack0xffffffffffffffd0,
                                (long)(iVar6 * *piVar3 + local_730 * 3 + local_734));
                in_stack_fffffffffffff610 =
                     testing::Message::operator<<
                               ((Message *)
                                CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                                (float *)CONCAT44(in_stack_fffffffffffff54c,
                                                  in_stack_fffffffffffff548));
                in_stack_fffffffffffff608 =
                     (float *)testing::AssertionResult::failure_message((AssertionResult *)0x5cb252)
                ;
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)
                           CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580),
                           (Type)((ulong)in_stack_fffffffffffff578 >> 0x20),
                           (char *)in_stack_fffffffffffff570,in_stack_fffffffffffff56c,
                           (char *)in_stack_fffffffffffff560);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)
                           CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                           (Message *)in_stack_fffffffffffff5c8);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)
                           CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
                testing::Message::~Message((Message *)0x5cb2b5);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x5cb30d);
              in_stack_fffffffffffff600 = &local_5a0;
              pbrt::Point2<int>::Point2
                        ((Point2<int> *)
                         CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                         (int)in_stack_fffffffffffff54c,in_stack_fffffffffffff548);
              pbrt::WrapMode2D::WrapMode2D
                        ((WrapMode2D *)in_stack_fffffffffffff560,in_stack_fffffffffffff55c);
              p_01.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff5e0;
              p_01.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff5dc;
              wrapMode_01.wrap.values[1] = in_stack_fffffffffffff5d8;
              wrapMode_01.wrap.values[0] = in_stack_fffffffffffff5d4;
              local_794 = pbrt::Image::GetChannel
                                    (in_stack_fffffffffffff5c8,p_01,
                                     (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20),wrapMode_01);
              pbrt::Point2<int>::Point2
                        ((Point2<int> *)
                         CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                         (int)in_stack_fffffffffffff54c,in_stack_fffffffffffff548);
              pbrt::WrapMode2D::WrapMode2D
                        ((WrapMode2D *)in_stack_fffffffffffff560,in_stack_fffffffffffff55c);
              p_02.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff5e0;
              p_02.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff5dc;
              wrapMode_02.wrap.values[1] = in_stack_fffffffffffff5d8;
              wrapMode_02.wrap.values[0] = in_stack_fffffffffffff5d4;
              pbrt::Image::GetChannel
                        (in_stack_fffffffffffff5c8,p_02,
                         (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20),wrapMode_02);
              local_7a8 = sRGBRoundTrip(in_stack_fffffffffffff550,in_stack_fffffffffffff54c);
              testing::internal::CmpHelperLE<float,float>
                        ((char *)in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,
                         in_stack_fffffffffffff608,(float *)in_stack_fffffffffffff600);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(local_790);
              if (!bVar1) {
                testing::Message::Message
                          ((Message *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580))
                ;
                pMVar4 = testing::Message::operator<<
                                   ((Message *)
                                    CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                                    (char (*) [4])
                                    CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
                in_stack_fffffffffffff5e0 = (int)pMVar4;
                pMVar4 = testing::Message::operator<<
                                   ((Message *)
                                    CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                                    (int *)CONCAT44(in_stack_fffffffffffff54c,
                                                    in_stack_fffffffffffff548));
                in_stack_fffffffffffff5d8 = (WrapMode)pMVar4;
                in_stack_fffffffffffff5dc = (int)((ulong)pMVar4 >> 0x20);
                pMVar4 = testing::Message::operator<<
                                   ((Message *)
                                    CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                                    (char (*) [5])
                                    CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
                in_stack_fffffffffffff5d0 = SUB84(pMVar4,0);
                in_stack_fffffffffffff5d4 = (WrapMode)((ulong)pMVar4 >> 0x20);
                in_stack_fffffffffffff5c8 =
                     (Image *)testing::Message::operator<<
                                        ((Message *)
                                         CONCAT44(in_stack_fffffffffffff554,
                                                  in_stack_fffffffffffff550),
                                         (int *)CONCAT44(in_stack_fffffffffffff54c,
                                                         in_stack_fffffffffffff548));
                in_stack_fffffffffffff5c0 =
                     testing::Message::operator<<
                               ((Message *)
                                CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                                (char (*) [5])
                                CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
                testing::Message::operator<<
                          ((Message *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                           (int *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
                testing::Message::operator<<
                          ((Message *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                           (char (*) [8])
                           CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
                iVar6 = local_72c * 3;
                piVar3 = pbrt::Tuple2<pbrt::Point2,_int>::operator[]
                                   ((Tuple2<pbrt::Point2,_int> *)&stack0xfffffffffffffff0,0);
                pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                          ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                           &stack0xffffffffffffffd0,
                           (long)(iVar6 * *piVar3 + local_730 * 3 + local_734));
                testing::Message::operator<<
                          ((Message *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                           (float *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
                testing::AssertionResult::failure_message((AssertionResult *)0x5cb618);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)
                           CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580),
                           (Type)((ulong)in_stack_fffffffffffff578 >> 0x20),
                           (char *)in_stack_fffffffffffff570,in_stack_fffffffffffff56c,
                           (char *)in_stack_fffffffffffff560);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)
                           CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                           (Message *)in_stack_fffffffffffff5c8);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)
                           CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
                testing::Message::~Message((Message *)0x5cb672);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x5cb6c7);
            }
          }
        }
        remove("test.png");
        testing::internal::EqHelper<true>::Compare<int,int>
                  ((char *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                   (char *)in_stack_fffffffffffff560,
                   (int *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),
                   (int *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                   (type *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
        uVar2 = testing::AssertionResult::operator_cast_to_bool(local_7d8);
        if (!(bool)uVar2) {
          testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffff580));
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x5cb7c6);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff580),
                     (Type)((ulong)pcVar5 >> 0x20),(char *)in_stack_fffffffffffff570,
                     in_stack_fffffffffffff56c,(char *)in_stack_fffffffffffff560);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                     (Message *)in_stack_fffffffffffff5c8);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
          testing::Message::~Message((Message *)0x5cb823);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5cb878);
        local_684 = 0;
      }
    }
  }
  pbrt::ImageAndMetadata::~ImageAndMetadata
            ((ImageAndMetadata *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
  pbrt::Image::~Image((Image *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
  return;
}

Assistant:

TEST(Image, PngRgbIO) {
    Point2i res(11, 50);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);

    Image image(rgbPixels, res, {"R", "G", "B"});
    EXPECT_TRUE(image.Write("test.png"));
    ImageAndMetadata read = Image::Read("test.png");

    EXPECT_EQ(image.Resolution(), read.image.Resolution());
    EXPECT_EQ(read.image.Format(), PixelFormat::U256);
    ASSERT_TRUE(read.image.Encoding() != nullptr);
    // EXPECT_EQ(*read.image.Encoding(), *ColorEncodingHandle::sRGB);
    ASSERT_TRUE((bool)read.metadata.colorSpace);
    ASSERT_TRUE(*read.metadata.colorSpace != nullptr);
    EXPECT_EQ(*RGBColorSpace::sRGB, *read.metadata.GetColorSpace());

    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x)
            for (int c = 0; c < 3; ++c) {
                EXPECT_LE(sRGBRoundTrip(image.GetChannel({x, y}, c), -.5f),
                          read.image.GetChannel({x, y}, c))
                    << " x " << x << ", y " << y << ", c " << c << ", orig "
                    << rgbPixels[3 * y * res[0] + 3 * x + c];
                EXPECT_LE(read.image.GetChannel({x, y}, c),
                          sRGBRoundTrip(image.GetChannel({x, y}, c), 0.5f))
                    << " x " << x << ", y " << y << ", c " << c << ", orig "
                    << rgbPixels[3 * y * res[0] + 3 * x + c];
            }

    EXPECT_EQ(0, remove("test.png"));
}